

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O1

IdentPtr __thiscall
HashTbl::PidHashNameLenWithHash<char>(HashTbl *this,char *prgch,char *end,int32 cch,uint32 luHash)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  code *pcVar4;
  bool bVar5;
  ULONG UVar6;
  undefined4 *puVar7;
  IdentPtr pIVar8;
  Ident *pIVar9;
  short *psVar10;
  long lVar11;
  uint uVar12;
  int cb;
  IdentPtr pIVar13;
  
  if (cch < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x104,"(cch >= 0)","cch >= 0");
    if (!bVar5) goto LAB_00e76d15;
    *puVar7 = 0;
  }
  if (prgch == (char *)0x0 && cch != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x105,"(cch == 0 || prgch != nullptr)","cch == 0 || prgch != nullptr");
    if (!bVar5) goto LAB_00e76d15;
    *puVar7 = 0;
  }
  UVar6 = CaseSensitiveComputeHash(prgch,end);
  if (UVar6 != luHash) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x106,"(luHash == CaseSensitiveComputeHash(prgch, end))",
                       "luHash == CaseSensitiveComputeHash(prgch, end)");
    if (!bVar5) {
LAB_00e76d15:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  uVar12 = this->m_luMask & luHash;
  pIVar13 = this->m_prgpidName[uVar12];
  if (pIVar13 == (IdentPtr)0x0) {
    pIVar13 = (IdentPtr)(this->m_prgpidName + uVar12);
    bVar5 = false;
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    do {
      pIVar8 = pIVar13;
      if ((pIVar8->m_luHash == luHash) && (pIVar8->m_cch == cch)) {
        lVar11 = 0;
        do {
          pcVar1 = prgch + lVar11;
          if (end <= pcVar1) {
            pIVar13 = (IdentPtr)0x0;
            bVar5 = false;
            goto LAB_00e76c28;
          }
          lVar2 = lVar11 * 2;
          lVar11 = lVar11 + 1;
        } while ((uint)*(ushort *)(&pIVar8->field_0x22 + lVar2) == (int)*pcVar1);
      }
      uVar12 = uVar12 + 1;
      pIVar13 = pIVar8->m_pidNext;
    } while (pIVar8->m_pidNext != (Ident *)0x0);
    bVar5 = 5 < uVar12;
    pIVar13 = pIVar8;
  }
  pIVar8 = (IdentPtr)0x0;
LAB_00e76c28:
  if (pIVar8 != (IdentPtr)0x0) {
    return pIVar8;
  }
  if ((bool)(bVar5 & this->m_luMask < this->m_luCount)) {
    Grow(this);
    pIVar8 = (IdentPtr)(this->m_prgpidName + (this->m_luMask & luHash));
    do {
      pIVar13 = pIVar8;
      pIVar8 = pIVar13->m_pidNext;
    } while (pIVar13->m_pidNext != (Ident *)0x0);
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this->stats,uVar12 + 1);
  }
  if ((((cch != -1) && (cch + 1U < 0x7fffffec)) && (cb = (cch + 1U) * 2 + 0x28, -1 < cb)) &&
     (pIVar9 = (Ident *)NoReleaseAllocator::Alloc(&this->m_noReleaseAllocator,cb),
     pIVar9 != (Ident *)0x0)) {
    pIVar13->m_pidNext = pIVar9;
    this->m_luCount = this->m_luCount + 1;
    pIVar9->m_pidNext = (Ident *)0x0;
    pIVar9->m_pidRefStack = (PidRefStack *)0x0;
    pIVar9->m_tk = 0x90;
    pIVar9->m_grfid = 0;
    pIVar9->m_luHash = luHash;
    pIVar9->m_cch = cch;
    pIVar9->m_propertyId = -1;
    pIVar9->assignmentState = NotAssigned;
    pIVar9->isUsedInLdElem = false;
    psVar10 = (short *)&pIVar9->field_0x22;
    if (prgch < end) {
      do {
        cVar3 = *prgch;
        prgch = prgch + 1;
        *psVar10 = (short)cVar3;
        psVar10 = psVar10 + 1;
      } while (prgch != end);
    }
    *psVar10 = 0;
    return pIVar9;
  }
  OutOfMemory();
}

Assistant:

IdentPtr HashTbl::PidHashNameLenWithHash(_In_reads_(cch) CharType const * prgch, CharType const * end, int32 cch, uint32 luHash)
{
    Assert(cch >= 0);
    Assert(cch == 0 || prgch != nullptr);
    Assert(luHash == CaseSensitiveComputeHash(prgch, end));

    IdentPtr * ppid = nullptr;
    IdentPtr pid;
    LONG cb;
    int32 bucketCount;


#if PROFILE_DICTIONARY
    int depth = 0;
#endif

    pid = this->FindExistingPid(prgch, end, cch, luHash, &ppid, &bucketCount
#if PROFILE_DICTIONARY
                                , depth
#endif
        );
    if (pid)
    {
        return pid;
    }

    if (bucketCount > BucketLengthLimit && m_luCount > m_luMask)
    {
        Grow();

        // ppid is now invalid because the Grow() moves the entries around.
        // Find the correct ppid by repeating the find of the end of the bucket
        // the new item will be placed in.
        // Note this is similar to the main find loop but does not count nor does it
        // look at the entries because we already proved above the entry is not in the
        // table, we just want to find the end of the bucket.
        ppid = &m_prgpidName[luHash & m_luMask];
        while (*ppid)
            ppid = &(*ppid)->m_pidNext;
    }


#if PROFILE_DICTIONARY
    ++depth;
    if (stats)
        stats->Insert(depth);
#endif

    //Windows OS Bug 1795286 : CENTRAL PREFAST RUN: inetcore\scriptengines\src\src\core\hash.cpp :
    //               'sizeof((*pid))+((cch+1))*sizeof(OLECHAR)' may be smaller than
    //               '((cch+1))*sizeof(OLECHAR)'. This can be caused by integer overflows
    //               or underflows. This could yield an incorrect buffer all
    /* Allocate space for the identifier */
    ULONG Len;

    if (FAILED(ULongAdd(cch, 1, &Len)) ||
        FAILED(ULongMult(Len, sizeof(OLECHAR), &Len)) ||
        FAILED(ULongAdd(Len, sizeof(*pid), &Len)) ||
        FAILED(ULongToLong(Len, &cb)))
    {
        cb = 0;
        OutOfMemory();
    }


    if (nullptr == (pid = (IdentPtr)m_noReleaseAllocator.Alloc(cb)))
        OutOfMemory();

    /* Insert the identifier into the hash list */
    *ppid = pid;

    // Increment the number of entries in the table.
    m_luCount++;

    /* Fill in the identifier record */
    pid->m_pidNext = nullptr;
    pid->m_tk = tkLim;
    pid->m_grfid = fidNil;
    pid->m_luHash = luHash;
    pid->m_cch = cch;
    pid->m_pidRefStack = nullptr;
    pid->m_propertyId = Js::Constants::NoProperty;
    pid->assignmentState = NotAssigned;
    pid->isUsedInLdElem = false;

    HashTbl::CopyString(pid->m_sz, prgch, end);

    return pid;
}